

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O0

void __thiscall sf2cute::RIFFListChunk::RIFFListChunk(RIFFListChunk *this,string *name)

{
  string local_38;
  string *local_18;
  string *name_local;
  RIFFListChunk *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  RIFFChunkInterface::RIFFChunkInterface(&this->super_RIFFChunkInterface);
  (this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface =
       (_func_int **)&PTR__RIFFListChunk_001639b8;
  std::__cxx11::string::string((string *)&this->name_);
  std::
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
  ::vector(&this->subchunks_);
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  set_name(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

RIFFListChunk::RIFFListChunk(std::string name) {
  set_name(std::move(name));
}